

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

void sha1ProcessChunk(Sha1State *state,uchar *buffer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  quint32 qVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long in_FS_OFFSET;
  quint32 local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  Sha1Chunk local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = state->h0;
  uVar6 = state->h1;
  uVar9 = state->h2;
  uVar8 = state->h3;
  qVar5 = state->h4;
  local_78._48_8_ = *(undefined8 *)(buffer + 0x30);
  local_78._56_8_ = *(undefined8 *)(buffer + 0x38);
  local_78._32_8_ = *(undefined8 *)(buffer + 0x20);
  local_78._40_8_ = *(undefined8 *)(buffer + 0x28);
  local_78._16_8_ = *(undefined8 *)(buffer + 0x10);
  local_78._24_8_ = *(undefined8 *)(buffer + 0x18);
  local_78._0_8_ = *(undefined8 *)buffer;
  local_78._8_8_ = *(undefined8 *)(buffer + 8);
  for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
    uVar10 = *(uint *)((long)&local_78 + lVar11 * 4);
    *(uint *)((long)&local_78 + lVar11 * 4) =
         uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  uVar10 = (uVar7 << 5 | uVar7 >> 0x1b) + ((uVar8 ^ uVar9) & uVar6 ^ uVar8) + qVar5 +
           local_78.words[0] + 0x5a827999;
  uVar6 = uVar6 << 0x1e | uVar6 >> 2;
  uVar12 = ((uVar9 ^ uVar6) & uVar7 ^ uVar9) + uVar8 + local_78.words[1] + 0x5a827999 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar8 = uVar7 << 0x1e | uVar7 >> 2;
  uVar9 = uVar9 + local_78.words[2] + ((uVar6 ^ uVar8) & uVar10 ^ uVar6) + 0x5a827999 +
          (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar7 = uVar6 + local_78.words[3] + ((uVar10 ^ uVar8) & uVar12 ^ uVar8) + 0x5a827999 +
          (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar6 = uVar8 + local_78.words[4] + ((uVar12 ^ uVar10) & uVar9 ^ uVar10) + 0x5a827999 +
          (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar9 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar8 = uVar10 + local_78.words[5] + ((uVar9 ^ uVar12) & uVar7 ^ uVar12) + 0x5a827999 +
          (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar10 = uVar12 + local_78.words[6] + ((uVar7 ^ uVar9) & uVar6 ^ uVar9) + 0x5a827999 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar9 = uVar9 + local_78.words[7] + ((uVar6 ^ uVar7) & uVar8 ^ uVar7) + 0x5a827999 +
          (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar7 = uVar7 + local_78.words[8] + ((uVar8 ^ uVar6) & uVar10 ^ uVar6) + 0x5a827999 +
          (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar6 = uVar6 + local_78.words[9] + ((uVar10 ^ uVar8) & uVar9 ^ uVar8) + 0x5a827999 +
          (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar9 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar8 = uVar8 + local_78.words[10] + ((uVar9 ^ uVar10) & uVar7 ^ uVar10) + 0x5a827999 +
          (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar10 = uVar10 + local_78.words[0xb] + ((uVar7 ^ uVar9) & uVar6 ^ uVar9) + 0x5a827999 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar9 = uVar9 + local_78.words[0xc] + ((uVar6 ^ uVar7) & uVar8 ^ uVar7) + 0x5a827999 +
          (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar7 = uVar7 + local_78.words[0xd] + ((uVar8 ^ uVar6) & uVar10 ^ uVar6) + 0x5a827999 +
          (uVar9 * 0x20 | uVar9 >> 0x1b);
  local_88 = uVar10 * 0x40000000 | uVar10 >> 2;
  local_7c = uVar6 + local_78.words[0xe] + ((local_88 ^ uVar8) & uVar9 ^ uVar8) + 0x5a827999 +
             (uVar7 * 0x20 | uVar7 >> 0x1b);
  local_84 = uVar9 * 0x40000000 | uVar9 >> 2;
  local_8c = uVar8 + local_78.words[0xf] + ((local_84 ^ local_88) & uVar7 ^ local_88) + 0x5a827999 +
             (local_7c * 0x20 | local_7c >> 0x1b);
  local_80 = uVar7 * 0x40000000 | uVar7 >> 2;
  sha1Round1(&local_78,0x10,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round1(&local_78,0x11,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round1(&local_78,0x12,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round1(&local_78,0x13,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round2(&local_78,0x14,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round2(&local_78,0x15,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round2(&local_78,0x16,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round2(&local_78,0x17,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round2(&local_78,0x18,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round2(&local_78,0x19,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round2(&local_78,0x1a,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round2(&local_78,0x1b,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round2(&local_78,0x1c,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round2(&local_78,0x1d,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round2(&local_78,0x1e,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round2(&local_78,0x1f,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round2(&local_78,0x20,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round2(&local_78,0x21,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round2(&local_78,0x22,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round2(&local_78,0x23,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round2(&local_78,0x24,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round2(&local_78,0x25,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round2(&local_78,0x26,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round2(&local_78,0x27,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round3(&local_78,0x28,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round3(&local_78,0x29,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round3(&local_78,0x2a,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round3(&local_78,0x2b,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round3(&local_78,0x2c,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round3(&local_78,0x2d,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round3(&local_78,0x2e,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round3(&local_78,0x2f,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round3(&local_78,0x30,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round3(&local_78,0x31,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round3(&local_78,0x32,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round3(&local_78,0x33,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round3(&local_78,0x34,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round3(&local_78,0x35,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round3(&local_78,0x36,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round3(&local_78,0x37,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round3(&local_78,0x38,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round3(&local_78,0x39,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round3(&local_78,0x3a,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round3(&local_78,0x3b,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round4(&local_78,0x3c,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round4(&local_78,0x3d,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round4(&local_78,0x3e,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round4(&local_78,0x3f,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round4(&local_78,0x40,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round4(&local_78,0x41,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round4(&local_78,0x42,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round4(&local_78,0x43,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round4(&local_78,0x44,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round4(&local_78,0x45,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round4(&local_78,0x46,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round4(&local_78,0x47,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round4(&local_78,0x48,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round4(&local_78,0x49,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round4(&local_78,0x4a,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  sha1Round4(&local_78,0x4b,&local_7c,&local_80,&local_84,&local_88,&local_8c);
  sha1Round4(&local_78,0x4c,&local_8c,&local_7c,&local_80,&local_84,&local_88);
  sha1Round4(&local_78,0x4d,&local_88,&local_8c,&local_7c,&local_80,&local_84);
  sha1Round4(&local_78,0x4e,&local_84,&local_88,&local_8c,&local_7c,&local_80);
  sha1Round4(&local_78,0x4f,&local_80,&local_84,&local_88,&local_8c,&local_7c);
  uVar1 = state->h0;
  uVar2 = state->h1;
  uVar3 = state->h2;
  uVar4 = state->h3;
  state->h0 = local_7c + uVar1;
  state->h1 = local_80 + uVar2;
  state->h2 = local_84 + uVar3;
  state->h3 = local_88 + uVar4;
  state->h4 = state->h4 + local_8c;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void sha1ProcessChunk(Sha1State *state, const unsigned char *buffer)
{
    // Copy state[] to working vars
    quint32 a = state->h0;
    quint32 b = state->h1;
    quint32 c = state->h2;
    quint32 d = state->h3;
    quint32 e = state->h4;

    quint8 chunkBuffer[64];
    memcpy(chunkBuffer, buffer, 64);

    Sha1Chunk *chunk = reinterpret_cast<Sha1Chunk*>(&chunkBuffer);

    for (int i = 0; i < 16; ++i)
        chunk->words[i] = qFromBigEndian(chunk->words[i]);

    sha1Round0(chunk,  0, a,b,c,d,e); sha1Round0(chunk,  1, e,a,b,c,d); sha1Round0(chunk,  2, d,e,a,b,c); sha1Round0(chunk,  3, c,d,e,a,b);
    sha1Round0(chunk,  4, b,c,d,e,a); sha1Round0(chunk,  5, a,b,c,d,e); sha1Round0(chunk,  6, e,a,b,c,d); sha1Round0(chunk,  7, d,e,a,b,c);
    sha1Round0(chunk,  8, c,d,e,a,b); sha1Round0(chunk,  9, b,c,d,e,a); sha1Round0(chunk, 10, a,b,c,d,e); sha1Round0(chunk, 11, e,a,b,c,d);
    sha1Round0(chunk, 12, d,e,a,b,c); sha1Round0(chunk, 13, c,d,e,a,b); sha1Round0(chunk, 14, b,c,d,e,a); sha1Round0(chunk, 15, a,b,c,d,e);
    sha1Round1(chunk, 16, e,a,b,c,d); sha1Round1(chunk, 17, d,e,a,b,c); sha1Round1(chunk, 18, c,d,e,a,b); sha1Round1(chunk, 19, b,c,d,e,a);
    sha1Round2(chunk, 20, a,b,c,d,e); sha1Round2(chunk, 21, e,a,b,c,d); sha1Round2(chunk, 22, d,e,a,b,c); sha1Round2(chunk, 23, c,d,e,a,b);
    sha1Round2(chunk, 24, b,c,d,e,a); sha1Round2(chunk, 25, a,b,c,d,e); sha1Round2(chunk, 26, e,a,b,c,d); sha1Round2(chunk, 27, d,e,a,b,c);
    sha1Round2(chunk, 28, c,d,e,a,b); sha1Round2(chunk, 29, b,c,d,e,a); sha1Round2(chunk, 30, a,b,c,d,e); sha1Round2(chunk, 31, e,a,b,c,d);
    sha1Round2(chunk, 32, d,e,a,b,c); sha1Round2(chunk, 33, c,d,e,a,b); sha1Round2(chunk, 34, b,c,d,e,a); sha1Round2(chunk, 35, a,b,c,d,e);
    sha1Round2(chunk, 36, e,a,b,c,d); sha1Round2(chunk, 37, d,e,a,b,c); sha1Round2(chunk, 38, c,d,e,a,b); sha1Round2(chunk, 39, b,c,d,e,a);
    sha1Round3(chunk, 40, a,b,c,d,e); sha1Round3(chunk, 41, e,a,b,c,d); sha1Round3(chunk, 42, d,e,a,b,c); sha1Round3(chunk, 43, c,d,e,a,b);
    sha1Round3(chunk, 44, b,c,d,e,a); sha1Round3(chunk, 45, a,b,c,d,e); sha1Round3(chunk, 46, e,a,b,c,d); sha1Round3(chunk, 47, d,e,a,b,c);
    sha1Round3(chunk, 48, c,d,e,a,b); sha1Round3(chunk, 49, b,c,d,e,a); sha1Round3(chunk, 50, a,b,c,d,e); sha1Round3(chunk, 51, e,a,b,c,d);
    sha1Round3(chunk, 52, d,e,a,b,c); sha1Round3(chunk, 53, c,d,e,a,b); sha1Round3(chunk, 54, b,c,d,e,a); sha1Round3(chunk, 55, a,b,c,d,e);
    sha1Round3(chunk, 56, e,a,b,c,d); sha1Round3(chunk, 57, d,e,a,b,c); sha1Round3(chunk, 58, c,d,e,a,b); sha1Round3(chunk, 59, b,c,d,e,a);
    sha1Round4(chunk, 60, a,b,c,d,e); sha1Round4(chunk, 61, e,a,b,c,d); sha1Round4(chunk, 62, d,e,a,b,c); sha1Round4(chunk, 63, c,d,e,a,b);
    sha1Round4(chunk, 64, b,c,d,e,a); sha1Round4(chunk, 65, a,b,c,d,e); sha1Round4(chunk, 66, e,a,b,c,d); sha1Round4(chunk, 67, d,e,a,b,c);
    sha1Round4(chunk, 68, c,d,e,a,b); sha1Round4(chunk, 69, b,c,d,e,a); sha1Round4(chunk, 70, a,b,c,d,e); sha1Round4(chunk, 71, e,a,b,c,d);
    sha1Round4(chunk, 72, d,e,a,b,c); sha1Round4(chunk, 73, c,d,e,a,b); sha1Round4(chunk, 74, b,c,d,e,a); sha1Round4(chunk, 75, a,b,c,d,e);
    sha1Round4(chunk, 76, e,a,b,c,d); sha1Round4(chunk, 77, d,e,a,b,c); sha1Round4(chunk, 78, c,d,e,a,b); sha1Round4(chunk, 79, b,c,d,e,a);

    // Add the working vars back into state
    state->h0 += a;
    state->h1 += b;
    state->h2 += c;
    state->h3 += d;
    state->h4 += e;

    // Wipe variables
#ifdef SHA1_WIPE_VARIABLES
    a = b = c = d = e = 0;
    memset(chunkBuffer, 0, 64);
#endif
}